

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifsysinfo(bifcxdef *ctx,int argc)

{
  runsdef **pprVar1;
  runsdef *prVar2;
  int iVar3;
  size_t len;
  dattyp typ;
  uint uVar4;
  char *str;
  long num;
  runcxdef *prVar5;
  runsdef val;
  runsdef local_18;
  
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  prVar5 = ctx->bifcxrun;
  if (prVar2[-1].runstyp != '\x01') {
    prVar5->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3eb);
  }
  iVar3 = *(int *)&prVar5->runcxsp->runsv;
  switch(iVar3) {
  case 1:
    local_18.runstyp = '\b';
    typ = 8;
    break;
  case 2:
    str = "2.5.17";
    len = 6;
    goto LAB_0020f47a;
  case 3:
    str = "POSIX_UNIX_MSWINDOWS";
    len = 0x14;
LAB_0020f47a:
    runpushcstr(prVar5,str,len,0);
    return;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x22:
    iVar3 = os_get_sysinfo(iVar3,(void *)0x0,(long *)&local_18);
    prVar5 = ctx->bifcxrun;
    if (iVar3 == 0) {
      runpnil(prVar5);
      return;
    }
LAB_0020f431:
    num = CONCAT71(local_18._1_7_,local_18.runstyp);
    goto LAB_0020f435;
  case 0x13:
    iVar3 = tio_is_html_mode();
    typ = (uint)(iVar3 != 0) * 3 + 5;
    local_18.runstyp = (uchar)typ;
    prVar5 = ctx->bifcxrun;
    break;
  case 0x20:
    iVar3 = os_get_sysinfo(4,(void *)0x0,(long *)&local_18);
    if ((iVar3 == 0) || (CONCAT71(local_18._1_7_,local_18.runstyp) == 0)) {
      prVar5 = ctx->bifcxrun;
    }
    else {
      iVar3 = os_get_sysinfo(0x20,(void *)0x0,(long *)&local_18);
      prVar5 = ctx->bifcxrun;
      if (iVar3 != 0) goto LAB_0020f431;
    }
    num = 0;
LAB_0020f435:
    runpnum(prVar5,num);
    return;
  case 0x21:
    runpnum(prVar5,0);
    return;
  default:
    if (1 < argc) {
      uVar4 = argc + 1;
      do {
        pprVar1 = &ctx->bifcxrun->runcxsp;
        *pprVar1 = *pprVar1 + -1;
        uVar4 = uVar4 - 1;
      } while (2 < uVar4);
      prVar5 = ctx->bifcxrun;
    }
    runpnil(prVar5);
    return;
  }
  runpush(prVar5,typ,&local_18);
  return;
}

Assistant:

void bifsysinfo(bifcxdef *ctx, int argc)
{
    runsdef val;
    int id;
    long result;

    /* see what we have */
    switch(id = (int)runpopnum(ctx->bifcxrun))
    {
    case SYSINFO_SYSINFO:
        /* systemInfo call is supported in this version - return true */
        bifcntargs(ctx, 1, argc);
        val.runstyp = DAT_TRUE;
        runpush(ctx->bifcxrun, DAT_TRUE, &val);
        break;

    case SYSINFO_VERSION:
        /* get the run-time version string */
        bifcntargs(ctx, 1, argc);
        runpushcstr(ctx->bifcxrun, TADS_RUNTIME_VERSION,
                    strlen(TADS_RUNTIME_VERSION), 0);
        break;

    case SYSINFO_OS_NAME:
        /* get the operating system name */
        bifcntargs(ctx, 1, argc);
        runpushcstr(ctx->bifcxrun, OS_SYSTEM_NAME, strlen(OS_SYSTEM_NAME), 0);
        break;
        
    case SYSINFO_HTML:
    case SYSINFO_JPEG:
    case SYSINFO_PNG:
    case SYSINFO_WAV:
    case SYSINFO_MIDI:
    case SYSINFO_WAV_MIDI_OVL:
    case SYSINFO_WAV_OVL:
    case SYSINFO_PREF_IMAGES:
    case SYSINFO_PREF_SOUNDS:
    case SYSINFO_PREF_MUSIC:
    case SYSINFO_PREF_LINKS:
    case SYSINFO_MPEG:
    case SYSINFO_MPEG1:
    case SYSINFO_MPEG2:
    case SYSINFO_MPEG3:
    case SYSINFO_LINKS_HTTP:
    case SYSINFO_LINKS_FTP:
    case SYSINFO_LINKS_NEWS:
    case SYSINFO_LINKS_MAILTO:
    case SYSINFO_LINKS_TELNET:
    case SYSINFO_PNG_TRANS:
    case SYSINFO_PNG_ALPHA:
    case SYSINFO_OGG:
    case SYSINFO_MNG:
    case SYSINFO_MNG_TRANS:
    case SYSINFO_MNG_ALPHA:
    case SYSINFO_TEXT_HILITE:
    case SYSINFO_INTERP_CLASS:
        /* 
         *   these information types are all handled by the OS layer, and
         *   take no additional arguments 
         */
        bifcntargs(ctx, 1, argc);
        if (os_get_sysinfo(id, 0, &result))
        {
            /* we got a valid result - return it */
            runpnum(ctx->bifcxrun, result);
        }
        else
        {
            /* the code was unknown - return nil */
            runpnil(ctx->bifcxrun);
        }
        break;

    case SYSINFO_HTML_MODE:
        /* ask the output formatter for its current HTML setting */
        bifcntargs(ctx, 1, argc);
        val.runstyp = runclog(tio_is_html_mode());
        runpush(ctx->bifcxrun, val.runstyp, &val);
        break;

    case SYSINFO_TEXT_COLORS:
        /* 
         *   Text colors are only supported in full HTML interpreters.  If
         *   this is an HTML interpreter, ask the underlying OS layer about
         *   color support; otherwise, colors are not available, since we
         *   don't handle colors in our text-only HTML subset.
         *   
         *   Colors are NOT supported in the HTML mini-parser in text-only
         *   interpreters in TADS 2.  So, even if we're running in HTML
         *   mode, if this is a text-only interpreter, we can't display text
         *   colors.  
         */
        bifcntargs(ctx, 1, argc);
        if (os_get_sysinfo(SYSINFO_HTML, 0, &result) && result != 0)
        {
            /* 
             *   we're in HTML mode, so ask the underlying HTML OS
             *   implementation for its level of text color support 
             */
            if (os_get_sysinfo(id, 0, &result))
            {
                /* push the OS-level result */
                runpnum(ctx->bifcxrun, result);
            }
            else
            {
                /* the OS code doesn't recognize it; assume no support */
                runpnum(ctx->bifcxrun, SYSINFO_TXC_NONE);
            }
        }
        else
        {
            /* we're a text-only interpreter - no color support */
            runpnum(ctx->bifcxrun, SYSINFO_TXC_NONE);
        }
        break;

    case SYSINFO_BANNERS:
        /* TADS 2 does not offer banner support */
        bifcntargs(ctx, 1, argc);
        runpnum(ctx->bifcxrun, 0);
        break;
        
    default:
        /* 
         *   Other codes fail harmlessly with a nil return value.  Pop all
         *   remaining arguments and return nil. 
         */
        for ( ; argc > 1 ; --argc)
            rundisc(ctx->bifcxrun);
        runpnil(ctx->bifcxrun);
        break;
    }
}